

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O3

NewOrderSingle * __thiscall
Application::queryNewOrderSingle40(NewOrderSingle *__return_storage_ptr__,Application *this)

{
  char cVar1;
  Application *pAVar2;
  FieldBase *pFVar3;
  OrdType ordType;
  FieldBase local_280;
  undefined1 local_228 [48];
  _Alloc_hider local_1f8;
  size_type local_1f0;
  field_metrics local_1d8;
  FieldBase local_1d0;
  FieldBase local_178;
  FieldBase local_120;
  FieldBase local_c8;
  FieldBase local_70;
  
  pAVar2 = (Application *)0x28;
  FIX::CharField::CharField((CharField *)local_228,0x28);
  local_228._0_8_ = &PTR__FieldBase_00152008;
  queryClOrdID((ClOrdID *)&local_280,pAVar2);
  pAVar2 = (Application *)0x15;
  FIX::CharField::CharField((CharField *)&local_178,0x15,'1');
  local_178._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00152078;
  querySymbol((Symbol *)&local_70,pAVar2);
  querySide((Side *)&local_c8,pAVar2);
  queryOrderQty((OrderQty *)&local_120,pAVar2);
  queryOrdType((OrdType *)&local_1d0,pAVar2);
  local_228._8_4_ = local_1d0.m_tag;
  std::__cxx11::string::_M_assign((string *)(local_228 + 0x10));
  local_1d8 = local_1d0.m_metrics;
  local_1f0 = 0;
  *local_1f8._M_p = '\0';
  pFVar3 = &local_280;
  FIX40::NewOrderSingle::NewOrderSingle
            (__return_storage_ptr__,(ClOrdID *)pFVar3,(HandlInst *)&local_178,(Symbol *)&local_70,
             (Side *)&local_c8,(OrderQty *)&local_120,(OrdType *)local_228);
  FIX::FieldBase::~FieldBase(&local_1d0);
  FIX::FieldBase::~FieldBase(&local_120);
  FIX::FieldBase::~FieldBase(&local_c8);
  FIX::FieldBase::~FieldBase(&local_70);
  FIX::FieldBase::~FieldBase(&local_178);
  FIX::FieldBase::~FieldBase(&local_280);
  queryTimeInForce((TimeInForce *)&local_280,(Application *)pFVar3);
  pFVar3 = &local_280;
  FIX::FieldMap::setField((FieldMap *)__return_storage_ptr__,pFVar3,true);
  FIX::FieldBase::~FieldBase(&local_280);
  cVar1 = FIX::CharField::getValue((CharField *)local_228);
  if (cVar1 == '2') {
LAB_0011197d:
    queryPrice((Price *)&local_280,(Application *)pFVar3);
    pFVar3 = &local_280;
    FIX::FieldMap::setField((FieldMap *)__return_storage_ptr__,pFVar3,true);
    FIX::FieldBase::~FieldBase(&local_280);
  }
  else {
    cVar1 = FIX::CharField::getValue((CharField *)local_228);
    if (cVar1 == '4') goto LAB_0011197d;
  }
  cVar1 = FIX::CharField::getValue((CharField *)local_228);
  if (cVar1 != '3') {
    cVar1 = FIX::CharField::getValue((CharField *)local_228);
    if (cVar1 != '4') goto LAB_001119e5;
  }
  queryStopPx((StopPx *)&local_280,(Application *)pFVar3);
  FIX::FieldMap::setField((FieldMap *)__return_storage_ptr__,&local_280,true);
  FIX::FieldBase::~FieldBase(&local_280);
LAB_001119e5:
  queryHeader(this,(Header *)&(__return_storage_ptr__->super_Message).field_0x70);
  FIX::FieldBase::~FieldBase((FieldBase *)local_228);
  return __return_storage_ptr__;
}

Assistant:

FIX40::NewOrderSingle Application::queryNewOrderSingle40() {
  FIX::OrdType ordType;

  FIX40::NewOrderSingle newOrderSingle(
      queryClOrdID(),
      FIX::HandlInst('1'),
      querySymbol(),
      querySide(),
      queryOrderQty(),
      ordType = queryOrdType());

  newOrderSingle.set(queryTimeInForce());
  if (ordType == FIX::OrdType_LIMIT || ordType == FIX::OrdType_STOP_LIMIT) {
    newOrderSingle.set(queryPrice());
  }
  if (ordType == FIX::OrdType_STOP || ordType == FIX::OrdType_STOP_LIMIT) {
    newOrderSingle.set(queryStopPx());
  }

  queryHeader(newOrderSingle.getHeader());
  return newOrderSingle;
}